

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

m256v * m256v_make(m256v *__return_storage_ptr__,int n_row,int n_col,uint8_t *memory)

{
  __return_storage_ptr__->n_row = n_row;
  __return_storage_ptr__->n_col = n_col;
  __return_storage_ptr__->rstride = (long)n_col;
  __return_storage_ptr__->e = memory;
  return __return_storage_ptr__;
}

Assistant:

m256v m256v_make(int n_row, int n_col, uint8_t* memory)
{
	m256v ret;
	ret.n_row = n_row;
	ret.n_col = n_col;
	ret.rstride = n_col;
	ret.e = memory;
	return ret;
}